

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O2

bool google::protobuf::compiler::GenerateCode
               (CodeGeneratorRequest *request,CodeGenerator *generator,
               CodeGeneratorResponse *response,string *error_msg)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  int iVar1;
  uint uVar2;
  FeatureSetDefaults *from;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>_>
  *proto;
  FileDescriptor *pFVar3;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar4;
  GeneratorContext GVar5;
  undefined4 extraout_var;
  Arena *arena;
  bool bVar6;
  int i;
  int iVar7;
  undefined1 *compiler_version;
  string_view sVar8;
  Status status;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  GeneratorResponseContext context;
  string error;
  string local_140;
  StatusOr<google::protobuf::FeatureSetDefaults> defaults;
  FeatureSetDefaults local_e0;
  DescriptorPool pool;
  
  DescriptorPool::DescriptorPool(&pool);
  CodeGenerator::BuildFeatureSetDefaults(&defaults,generator);
  if (defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>.field_0 !=
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)0x1) {
    context._0_16_ = absl::lts_20250127::NullSafeStringView("error generating feature defaults: ");
    error._0_16_ = absl::lts_20250127::Status::message((Status *)&defaults);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_140,(lts_20250127 *)&context,(AlphaNum *)&error,(AlphaNum *)&error);
    std::__cxx11::string::operator=((string *)error_msg,(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    bVar6 = false;
    goto LAB_00121656;
  }
  from = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::value(&defaults);
  FeatureSetDefaults::FeatureSetDefaults(&local_e0,from);
  DescriptorPool::SetFeatureSetDefaults((DescriptorPool *)&status,(FeatureSetDefaults *)&pool);
  FeatureSetDefaults::~FeatureSetDefaults(&local_e0);
  if (status.rep_ != 1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&context,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/plugin.cc"
               ,0x6f,"status.ok()");
    sVar8 = absl::lts_20250127::Status::message(&status);
    absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)&context,sVar8);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&context)
    ;
  }
  iVar7 = 0;
  do {
    if (*(int *)((long)&request->field_0 + 0x28) <= iVar7) {
      parsed_files.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parsed_files.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      parsed_files.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this = &(request->field_0)._impl_.file_to_generate_;
      iVar7 = 0;
      goto LAB_00121477;
    }
    proto = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                      (&(request->field_0)._impl_.proto_file_.super_RepeatedPtrFieldBase,iVar7);
    pFVar3 = DescriptorPool::BuildFile(&pool,proto);
    iVar7 = iVar7 + 1;
  } while (pFVar3 != (FileDescriptor *)0x0);
  bVar6 = false;
  goto LAB_0012164e;
LAB_00121477:
  iVar1 = *(int *)((long)&request->field_0 + 0x10);
  bVar6 = iVar1 <= iVar7;
  if (iVar1 <= iVar7) goto LAB_001214c6;
  pVVar4 = internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                     (&this->super_RepeatedPtrFieldBase,iVar7);
  sVar8._M_str = (pVVar4->_M_dataplus)._M_p;
  sVar8._M_len = pVVar4->_M_string_length;
  GVar5._vptr_GeneratorContext = (_func_int **)DescriptorPool::FindFileByName(&pool,sVar8);
  context.super_GeneratorContext._vptr_GeneratorContext = GVar5._vptr_GeneratorContext;
  std::
  vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
  ::emplace_back<google::protobuf::FileDescriptor_const*>
            ((vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)&parsed_files,(FileDescriptor **)&context);
  if (parsed_files.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] == (FileDescriptor *)0x0) {
    context._0_16_ =
         absl::lts_20250127::NullSafeStringView
                   (
                   "protoc asked plugin to generate a file but did not provide a descriptor for the file: "
                   );
    pVVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (&this->super_RepeatedPtrFieldBase,iVar7);
    error._M_string_length = (size_type)(pVVar4->_M_dataplus)._M_p;
    error._M_dataplus._M_p = (pointer)pVVar4->_M_string_length;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_140,(lts_20250127 *)&context,(AlphaNum *)&error,
               (AlphaNum *)error._M_string_length);
    std::__cxx11::string::operator=((string *)error_msg,(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    goto LAB_00121644;
  }
  iVar7 = iVar7 + 1;
  goto LAB_00121477;
LAB_001214c6:
  compiler_version = (undefined1 *)(request->field_0)._impl_.compiler_version_;
  if ((Version *)compiler_version == (Version *)0x0) {
    compiler_version = _Version_default_instance_;
  }
  GeneratorResponseContext::GeneratorResponseContext
            (&context,(Version *)compiler_version,response,&parsed_files);
  error._M_string_length = 0;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error.field_2._M_local_buf[0] = '\0';
  iVar7 = (*generator->_vptr_CodeGenerator[3])
                    (generator,&parsed_files,
                     (ulong)(request->field_0)._impl_.parameter_.tagged_ptr_.ptr_ &
                     0xfffffffffffffffc,&context,&error);
  iVar1 = (*generator->_vptr_CodeGenerator[4])(generator);
  (response->field_0)._impl_.supported_features_ = CONCAT44(extraout_var,iVar1);
  *(byte *)&response->field_0 = *(byte *)&response->field_0 | 2;
  iVar1 = (*generator->_vptr_CodeGenerator[7])(generator);
  (response->field_0)._impl_.minimum_edition_ = iVar1;
  *(byte *)&response->field_0 = *(byte *)&response->field_0 | 4;
  iVar1 = (*generator->_vptr_CodeGenerator[8])(generator);
  (response->field_0)._impl_.maximum_edition_ = iVar1;
  uVar2 = (response->field_0)._impl_._has_bits_.has_bits_[0] | 8;
  *(uint *)&response->field_0 = uVar2;
  if ((char)iVar7 == '\0') {
    if (error._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&error);
      goto LAB_0012158e;
    }
LAB_0012159d:
    (response->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 1;
    arena = (Arena *)(response->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>(&(response->field_0)._impl_.error_,&error,arena);
  }
  else {
LAB_0012158e:
    if (error._M_string_length != 0) {
      uVar2 = (response->field_0)._impl_._has_bits_.has_bits_[0];
      goto LAB_0012159d;
    }
  }
  std::__cxx11::string::~string((string *)&error);
  GeneratorResponseContext::~GeneratorResponseContext(&context);
LAB_00121644:
  std::
  _Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Vector_base(&parsed_files.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 );
LAB_0012164e:
  absl::lts_20250127::Status::~Status(&status);
LAB_00121656:
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
  ~StatusOrData(&defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>);
  DescriptorPool::~DescriptorPool(&pool);
  return bVar6;
}

Assistant:

bool GenerateCode(const CodeGeneratorRequest& request,
                  const CodeGenerator& generator,
                  CodeGeneratorResponse* response, std::string* error_msg) {
  DescriptorPool pool;

  // Initialize feature set default mapping.
  absl::StatusOr<FeatureSetDefaults> defaults =
      generator.BuildFeatureSetDefaults();
  if (!defaults.ok()) {
    *error_msg = absl::StrCat("error generating feature defaults: ",
                              defaults.status().message());
    return false;
  }
  absl::Status status = pool.SetFeatureSetDefaults(std::move(defaults).value());
  ABSL_CHECK(status.ok()) << status.message();

  for (int i = 0; i < request.proto_file_size(); i++) {
    const FileDescriptor* file = pool.BuildFile(request.proto_file(i));
    if (file == nullptr) {
      // BuildFile() already wrote an error message.
      return false;
    }
  }

  std::vector<const FileDescriptor*> parsed_files;
  for (int i = 0; i < request.file_to_generate_size(); i++) {
    parsed_files.push_back(pool.FindFileByName(request.file_to_generate(i)));
    if (parsed_files.back() == nullptr) {
      *error_msg = absl::StrCat(
          "protoc asked plugin to generate a file but "
          "did not provide a descriptor for the file: ",
          request.file_to_generate(i));
      return false;
    }
  }

  GeneratorResponseContext context(request.compiler_version(), response,
                                   parsed_files);


  std::string error;
  bool succeeded = generator.GenerateAll(parsed_files, request.parameter(),
                                         &context, &error);

  response->set_supported_features(generator.GetSupportedFeatures());
  response->set_minimum_edition(
      static_cast<int>(generator.GetMinimumEdition()));
  response->set_maximum_edition(
      static_cast<int>(generator.GetMaximumEdition()));

  if (!succeeded && error.empty()) {
    error =
        "Code generator returned false but provided no error "
        "description.";
  }
  if (!error.empty()) {
    response->set_error(error);
  }

  return true;
}